

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O1

void __thiscall ProblemDecTiger::FillRewardModel(ProblemDecTiger *this)

{
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc000000000000000,this,0,0);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc000000000000000,this,1,0);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059400000000000,this,0,1);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0x4022000000000000,this,0,2);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059400000000000,this,0,3);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc049000000000000,this,0,4);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059000000000000,this,0,5);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0x4022000000000000,this,0,6);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059000000000000,this,0,7);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0x4034000000000000,this,0,8);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0x4022000000000000,this,1,1);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059400000000000,this,1,2);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0x4022000000000000,this,1,3);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0x4034000000000000,this,1,4);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059000000000000,this,1,5);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059400000000000,this,1,6);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc059000000000000,this,1,7);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x180))(0xc049000000000000,this,1,8);
  return;
}

Assistant:

void ProblemDecTiger::FillRewardModel()
{
    SetReward(SLEFT, LISTEN_LISTEN, -2);
    SetReward(SRIGHT, LISTEN_LISTEN, -2);
    SetReward(SLEFT, LISTEN_OPENLEFT, -101);
    SetReward(SLEFT, LISTEN_OPENRIGHT, +9);
    SetReward(SLEFT, OPENLEFT_LISTEN, -101);
    SetReward(SLEFT, OPENLEFT_OPENLEFT, -50);
    SetReward(SLEFT, OPENLEFT_OPENRIGHT, -100);
    SetReward(SLEFT, OPENRIGHT_LISTEN, +9);
    SetReward(SLEFT, OPENRIGHT_OPENLEFT, -100);
    SetReward(SLEFT, OPENRIGHT_OPENRIGHT, +20);
    SetReward(SRIGHT, LISTEN_OPENLEFT, +9);
    SetReward(SRIGHT, LISTEN_OPENRIGHT, -101);
    SetReward(SRIGHT, OPENLEFT_LISTEN, +9);
    SetReward(SRIGHT, OPENLEFT_OPENLEFT, +20);
    SetReward(SRIGHT, OPENLEFT_OPENRIGHT, -100);
    SetReward(SRIGHT, OPENRIGHT_LISTEN, -101);
    SetReward(SRIGHT, OPENRIGHT_OPENLEFT, -100);
    SetReward(SRIGHT, OPENRIGHT_OPENRIGHT, -50);
}